

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dense_main.cc
# Opt level: O2

int main(void)

{
  double dVar1;
  double *pdVar2;
  pointer ppVar3;
  int iVar4;
  undefined4 extraout_var;
  Variable<double> *v;
  ostream *poVar5;
  undefined4 extraout_var_00;
  pointer ppVar6;
  int i;
  int iVar7;
  initializer_list<unsigned_long> dims;
  initializer_list<unsigned_long> dims_00;
  string_view path;
  initializer_list<double> __l;
  allocator_type local_1e1;
  double local_1e0;
  DataLoader dataloader;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  x_and_ys;
  _Vector_base<yyml::nn::Variable<double>_*,_std::allocator<yyml::nn::Variable<double>_*>_>
  local_1a0;
  double local_188;
  double dStack_180;
  undefined8 local_178;
  TensorShape output_shape;
  SGDOptimizer optimizer;
  MyNN mynn;
  TensorShape local_e0;
  TensorShape local_b8;
  TensorShape input_shape;
  code *local_68 [2];
  code *local_58;
  code *local_50;
  _Vector_base<double,_std::allocator<double>_> local_48;
  
  MyNN::MyNN((MyNN *)&mynn.super_NN);
  yyml::nn::NN::Parameters
            ((vector<yyml::nn::Variable<double>_*,_std::allocator<yyml::nn::Variable<double>_*>_> *)
             &local_1a0,&mynn.super_NN);
  yyml::nn::SGDOptimizer::SGDOptimizer
            (&optimizer,
             (vector<yyml::nn::Variable<double>_*,_std::allocator<yyml::nn::Variable<double>_*>_> *)
             &local_1a0,0.001);
  std::_Vector_base<yyml::nn::Variable<double>_*,_std::allocator<yyml::nn::Variable<double>_*>_>::
  ~_Vector_base(&local_1a0);
  output_shape.dim = 1;
  output_shape.total = 2;
  dims._M_len = 2;
  dims._M_array = &output_shape.dim;
  yyml::TensorShape::TensorShape(&input_shape,dims);
  dataloader.data_.
  super__Vector_base<std::pair<yyml::nn::Variable<double>,_yyml::nn::Variable<double>_>,_std::allocator<std::pair<yyml::nn::Variable<double>,_yyml::nn::Variable<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x1;
  dataloader.data_.
  super__Vector_base<std::pair<yyml::nn::Variable<double>,_yyml::nn::Variable<double>_>,_std::allocator<std::pair<yyml::nn::Variable<double>,_yyml::nn::Variable<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x1;
  dims_00._M_len = 2;
  dims_00._M_array = (iterator)&dataloader;
  yyml::TensorShape::TensorShape(&output_shape,dims_00);
  yyml::TensorShape::TensorShape(&local_b8,&input_shape);
  yyml::TensorShape::TensorShape(&local_e0,&output_shape);
  path._M_str = "2d_normal_data.txt";
  path._M_len = 0x12;
  yyml::DataLoader::DataLoader(&dataloader,path,&local_b8,&local_e0);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&local_e0.dims.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&local_b8.dims.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  local_68[1] = (code *)0x0;
  local_68[0] = yyml::RandomNumberGenerator::NormalDistribution;
  local_50 = std::_Function_handler<double_(),_double_(*)()>::_M_invoke;
  local_58 = std::_Function_handler<double_(),_double_(*)()>::_M_manager;
  yyml::nn::OptimizerInterface::Apply
            (&optimizer.super_OptimizerInterface,(function<double_()> *)local_68);
  std::_Function_base::~_Function_base((_Function_base *)local_68);
  for (iVar7 = 0;
      ppVar3 = dataloader.data_.
               super__Vector_base<std::pair<yyml::nn::Variable<double>,_yyml::nn::Variable<double>_>,_std::allocator<std::pair<yyml::nn::Variable<double>,_yyml::nn::Variable<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish, iVar7 != 100; iVar7 = iVar7 + 1) {
    local_1e0 = 0.0;
    for (ppVar6 = dataloader.data_.
                  super__Vector_base<std::pair<yyml::nn::Variable<double>,_yyml::nn::Variable<double>_>,_std::allocator<std::pair<yyml::nn::Variable<double>,_yyml::nn::Variable<double>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; ppVar6 != ppVar3; ppVar6 = ppVar6 + 1)
    {
      yyml::nn::OptimizerInterface::ZeroGrad(&optimizer.super_OptimizerInterface);
      iVar4 = (**mynn.super_NN._vptr_NN)(&mynn,ppVar6);
      v = LossFunc((Variable<double> *)CONCAT44(extraout_var,iVar4),&ppVar6->second);
      dVar1 = *(v->values_).data_;
      yyml::nn::Backward<double>(v);
      local_1e0 = local_1e0 + dVar1;
      yyml::nn::SGDOptimizer::Step(&optimizer);
    }
    poVar5 = std::operator<<((ostream *)&std::cout,"TensorCreated: ");
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    std::endl<char,std::char_traits<char>>(poVar5);
    poVar5 = std::operator<<((ostream *)&std::cout,"TensorCopied: ");
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    std::endl<char,std::char_traits<char>>(poVar5);
    poVar5 = std::operator<<((ostream *)&std::cout,"TensorMoved: ");
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    std::endl<char,std::char_traits<char>>(poVar5);
    poVar5 = std::operator<<((ostream *)&std::cout,"TensorDestroyed: ");
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    std::endl<char,std::char_traits<char>>(poVar5);
    std::operator<<((ostream *)&std::cout,"Loss: ");
    poVar5 = std::ostream::_M_insert<double>(local_1e0);
    std::endl<char,std::char_traits<char>>(poVar5);
  }
  x_and_ys.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  x_and_ys.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  x_and_ys.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  for (ppVar6 = dataloader.data_.
                super__Vector_base<std::pair<yyml::nn::Variable<double>,_yyml::nn::Variable<double>_>,_std::allocator<std::pair<yyml::nn::Variable<double>,_yyml::nn::Variable<double>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; ppVar6 != ppVar3; ppVar6 = ppVar6 + 1) {
    iVar7 = (**mynn.super_NN._vptr_NN)(&mynn,ppVar6);
    pdVar2 = (ppVar6->first).values_.data_;
    local_188 = *pdVar2;
    dStack_180 = pdVar2[1];
    local_178 = **(undefined8 **)(CONCAT44(extraout_var_00,iVar7) + 0x28);
    __l._M_len = 3;
    __l._M_array = &local_188;
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)&local_48,__l,&local_1e1);
    std::
    vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>
    ::emplace_back<std::vector<double,std::allocator<double>>>
              ((vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>
                *)&x_and_ys,(vector<double,_std::allocator<double>_> *)&local_48);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_48);
  }
  OutputResult(&x_and_ys);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&x_and_ys);
  std::
  vector<std::pair<yyml::nn::Variable<double>,_yyml::nn::Variable<double>_>,_std::allocator<std::pair<yyml::nn::Variable<double>,_yyml::nn::Variable<double>_>_>_>
  ::~vector(&dataloader.data_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&output_shape.dims.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&input_shape.dims.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  yyml::nn::OptimizerInterface::~OptimizerInterface(&optimizer.super_OptimizerInterface);
  yyml::nn::NN::~NN(&mynn.super_NN);
  return 0;
}

Assistant:

int main() {
  MyNN mynn;
  SGDOptimizer optimizer(mynn.Parameters(), 0.001);
  TensorShape input_shape{1, 2}, output_shape{1, 1};
  {
    DataLoader dataloader("2d_normal_data.txt", input_shape, output_shape);
    optimizer.Apply(RandomNumberGenerator::NormalDistribution);

    for (int i = 0; i < 100; i++) {
      double iter_loss = 0;
      for (auto& [nn_input, label] : dataloader) {
        optimizer.ZeroGrad();
        auto* nn_output = mynn(&nn_input);
        auto* loss = LossFunc(nn_output, &label);
        iter_loss += loss->values_.data_[0];
        loss->Backward();
        optimizer.Step();
      }
      std::cout << "TensorCreated: " << Tensor<double>::created_ << std::endl;
      std::cout << "TensorCopied: " << Tensor<double>::copied_ << std::endl;
      std::cout << "TensorMoved: " << Tensor<double>::moved_ << std::endl;
      std::cout << "TensorDestroyed: " << Tensor<double>::destroyed_
                << std::endl;
      std::cout << "Loss: " << iter_loss << std::endl;
    }
    std::vector<std::vector<double>> x_and_ys;
    for (auto& [nn_input, _] : dataloader) {
      auto* nn_output = mynn(&nn_input);
      x_and_ys.emplace_back(std::vector<double>{nn_input.values_.data_[0],
                                                nn_input.values_.data_[1],
                                                nn_output->values_.data_[0]});
    }
    OutputResult(x_and_ys);
  }
}